

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_newc.c
# Opt level: O0

int write_header(archive_write *a,archive_entry *entry)

{
  archive_entry *paVar1;
  wchar_t wVar2;
  int iVar3;
  int iVar4;
  mode_t mVar5;
  uint uVar6;
  int *piVar7;
  char *pcVar8;
  char *pcVar9;
  dev_t dVar10;
  la_int64_t lVar11;
  time_t v;
  size_t sVar12;
  size_t local_b0;
  size_t len;
  archive_entry *entry_main;
  archive_string_conv *sconv;
  char h [76];
  int64_t ino;
  int local_38;
  int ret_final;
  int ret;
  int pathlength;
  char *path;
  char *p;
  cpio_conflict *cpio;
  archive_entry *entry_local;
  archive_write *a_local;
  
  p = (char *)a->format_data;
  ino._4_4_ = 0;
  cpio = (cpio_conflict *)entry;
  entry_local = (archive_entry *)a;
  entry_main = (archive_entry *)get_sconv(a);
  len = 0;
  wVar2 = _archive_entry_pathname_l
                    ((archive_entry *)cpio,(char **)&ret,&local_b0,(archive_string_conv *)entry_main
                    );
  if (wVar2 != L'\0') {
    piVar7 = __errno_location();
    paVar1 = entry_local;
    if (*piVar7 == 0xc) {
      archive_set_error((archive *)entry_local,0xc,"Can\'t allocate memory for Pathname");
      ino._4_4_ = -0x1e;
      goto LAB_001bef84;
    }
    pcVar8 = archive_entry_pathname((archive_entry *)cpio);
    pcVar9 = archive_string_conversion_charset_name((archive_string_conv *)entry_main);
    archive_set_error((archive *)paVar1,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar8,pcVar9)
    ;
    ino._4_4_ = -0x14;
  }
  iVar3 = (int)local_b0 + 1;
  memset(&sconv,0,0x4c);
  format_octal(0x71c7,&sconv,6);
  dVar10 = archive_entry_dev((archive_entry *)cpio);
  format_octal(dVar10,(void *)((long)&sconv + 6),6);
  iVar4 = synthesize_ino_value((cpio_conflict *)p,(archive_entry *)cpio);
  register0x00000000 = (ulong)iVar4;
  if ((long)register0x00000000 < 0) {
    archive_set_error((archive *)entry_local,0xc,"No memory for ino translation table");
    ino._4_4_ = -0x1e;
  }
  else if ((long)register0x00000000 < 0x40000) {
    format_octal(register0x00000000 & 0x3ffff,h + 4,6);
    mVar5 = archive_entry_mode((archive_entry *)cpio);
    format_octal((ulong)mVar5,h + 10,6);
    lVar11 = archive_entry_uid((archive_entry *)cpio);
    format_octal(lVar11,h + 0x10,6);
    lVar11 = archive_entry_gid((archive_entry *)cpio);
    format_octal(lVar11,h + 0x16,6);
    uVar6 = archive_entry_nlink((archive_entry *)cpio);
    format_octal((ulong)uVar6,h + 0x1c,6);
    mVar5 = archive_entry_filetype((archive_entry *)cpio);
    if ((mVar5 == 0x6000) ||
       (mVar5 = archive_entry_filetype((archive_entry *)cpio), mVar5 == 0x2000)) {
      dVar10 = archive_entry_rdev((archive_entry *)cpio);
      format_octal(dVar10,h + 0x22,6);
    }
    else {
      format_octal(0,h + 0x22,6);
    }
    v = archive_entry_mtime((archive_entry *)cpio);
    format_octal(v,h + 0x28,0xb);
    format_octal((long)iVar3,h + 0x33,6);
    mVar5 = archive_entry_filetype((archive_entry *)cpio);
    if (mVar5 != 0x8000) {
      archive_entry_set_size((archive_entry *)cpio,0);
    }
    wVar2 = _archive_entry_symlink_l
                      ((archive_entry *)cpio,&path,&local_b0,(archive_string_conv *)entry_main);
    if (wVar2 != L'\0') {
      piVar7 = __errno_location();
      paVar1 = entry_local;
      if (*piVar7 == 0xc) {
        archive_set_error((archive *)entry_local,0xc,"Can\'t allocate memory for Linkname");
        ino._4_4_ = -0x1e;
        goto LAB_001bef84;
      }
      pcVar8 = archive_entry_symlink((archive_entry *)cpio);
      pcVar9 = archive_string_conversion_charset_name((archive_string_conv *)entry_main);
      archive_set_error((archive *)paVar1,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar8,
                        pcVar9);
      ino._4_4_ = -0x14;
    }
    if (((local_b0 == 0) || (path == (char *)0x0)) || (*path == '\0')) {
      lVar11 = archive_entry_size((archive_entry *)cpio);
      local_38 = format_octal(lVar11,h + 0x39,0xb);
    }
    else {
      sVar12 = strlen(path);
      local_38 = format_octal(sVar12,h + 0x39,0xb);
    }
    if (local_38 == 0) {
      iVar4 = __archive_write_output((archive_write *)entry_local,&sconv,0x4c);
      if (iVar4 == 0) {
        iVar3 = __archive_write_output((archive_write *)entry_local,_ret,(long)iVar3);
        if (iVar3 == 0) {
          lVar11 = archive_entry_size((archive_entry *)cpio);
          paVar1 = entry_local;
          *(la_int64_t *)p = lVar11;
          if ((path != (char *)0x0) && (*path != '\0')) {
            sVar12 = strlen(path);
            iVar3 = __archive_write_output((archive_write *)paVar1,path,sVar12);
            if (iVar3 != 0) {
              ino._4_4_ = -0x1e;
            }
          }
        }
        else {
          ino._4_4_ = -0x1e;
        }
      }
      else {
        ino._4_4_ = -0x1e;
      }
    }
    else {
      archive_set_error((archive *)entry_local,0x22,"File is too large for cpio format.");
      ino._4_4_ = -0x19;
    }
  }
  else {
    archive_set_error((archive *)entry_local,0x22,"Too many files for this cpio format");
    ino._4_4_ = -0x1e;
  }
LAB_001bef84:
  archive_entry_free((archive_entry *)len);
  return ino._4_4_;
}

Assistant:

static int
write_header(struct archive_write *a, struct archive_entry *entry)
{
	int64_t ino;
	struct cpio *cpio;
	const char *p, *path;
	int pathlength, ret, ret_final;
	char h[c_header_size];
	struct archive_string_conv *sconv;
	struct archive_entry *entry_main;
	size_t len;
	int pad;

	cpio = (struct cpio *)a->format_data;
	ret_final = ARCHIVE_OK;
	sconv = get_sconv(a);

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pathname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ustar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif

	ret = archive_entry_pathname_l(entry, &path, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate pathname '%s' to %s",
		    archive_entry_pathname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	pathlength = (int)len + 1; /* Include trailing null. */

	memset(h, 0, c_header_size);
	format_hex(0x070701, h + c_magic_offset, c_magic_size);
	format_hex(archive_entry_devmajor(entry), h + c_devmajor_offset,
	    c_devmajor_size);
	format_hex(archive_entry_devminor(entry), h + c_devminor_offset,
	    c_devminor_size);

	ino = archive_entry_ino64(entry);
	if (ino > 0xffffffff) {
		archive_set_error(&a->archive, ERANGE,
		    "large inode number truncated");
		ret_final = ARCHIVE_WARN;
	}

	/* TODO: Set ret_final to ARCHIVE_WARN if any of these overflow. */
	format_hex(ino & 0xffffffff, h + c_ino_offset, c_ino_size);
	format_hex(archive_entry_mode(entry), h + c_mode_offset, c_mode_size);
	format_hex(archive_entry_uid(entry), h + c_uid_offset, c_uid_size);
	format_hex(archive_entry_gid(entry), h + c_gid_offset, c_gid_size);
	format_hex(archive_entry_nlink(entry), h + c_nlink_offset, c_nlink_size);
	if (archive_entry_filetype(entry) == AE_IFBLK
	    || archive_entry_filetype(entry) == AE_IFCHR) {
	    format_hex(archive_entry_rdevmajor(entry), h + c_rdevmajor_offset, c_rdevmajor_size);
	    format_hex(archive_entry_rdevminor(entry), h + c_rdevminor_offset, c_rdevminor_size);
	} else {
	    format_hex(0, h + c_rdevmajor_offset, c_rdevmajor_size);
	    format_hex(0, h + c_rdevminor_offset, c_rdevminor_size);
	}
	format_hex(archive_entry_mtime(entry), h + c_mtime_offset, c_mtime_size);
	format_hex(pathlength, h + c_namesize_offset, c_namesize_size);
	format_hex(0, h + c_checksum_offset, c_checksum_size);

	/* Non-regular files don't store bodies. */
	if (archive_entry_filetype(entry) != AE_IFREG)
		archive_entry_set_size(entry, 0);

	/* Symlinks get the link written as the body of the entry. */
	ret = archive_entry_symlink_l(entry, &p, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Likname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate linkname '%s' to %s",
		    archive_entry_symlink(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	if (len > 0 && p != NULL  &&  *p != '\0')
		ret = format_hex(strlen(p), h + c_filesize_offset,
		    c_filesize_size);
	else
		ret = format_hex(archive_entry_size(entry),
		    h + c_filesize_offset, c_filesize_size);
	if (ret) {
		archive_set_error(&a->archive, ERANGE,
		    "File is too large for this format.");
		ret_final = ARCHIVE_FAILED;
		goto exit_write_header;
	}

	ret = __archive_write_output(a, h, c_header_size);
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}

	/* Pad pathname to even length. */
	ret = __archive_write_output(a, path, pathlength);
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}
	pad = PAD4(pathlength + c_header_size);
	if (pad) {
		ret = __archive_write_output(a, "\0\0\0", pad);
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
	}

	cpio->entry_bytes_remaining = archive_entry_size(entry);
	cpio->padding = (int)PAD4(cpio->entry_bytes_remaining);

	/* Write the symlink now. */
	if (p != NULL  &&  *p != '\0') {
		ret = __archive_write_output(a, p, strlen(p));
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		pad = PAD4(strlen(p));
		ret = __archive_write_output(a, "\0\0\0", pad);
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
	}
exit_write_header:
	archive_entry_free(entry_main);
	return (ret_final);
}